

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

bool helics::changeDetected(defV *prevValue,NamedPoint *val,double deltaV)

{
  __type_conflict _Var1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  char *in_RSI;
  int __x;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  
  pcVar4 = in_RSI;
  pcVar3 = CLI::std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,in_RSI,in_EDX);
  __x = (int)in_RDI;
  __c = extraout_EDX;
  if ((pcVar3 == (char *)0x0) &&
     (uVar2 = std::isnan(*(double *)(in_RSI + 0x20)), __c = extraout_EDX_00, (uVar2 & 1) == 0)) {
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a11d1);
    std::abs(__x);
    bVar5 = in_XMM0_Qa < extraout_XMM0_Qa;
  }
  else {
    pcVar4 = CLI::std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index(in_RDI,pcVar4,__c);
    if (pcVar4 == (char *)0x6) {
      std::
      get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x3a120f);
      _Var1 = std::operator==(unaff_retaddr,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if ((_Var1) && (uVar2 = std::isnan(*(double *)(in_RSI + 0x20)), (uVar2 & 1) == 0)) {
        std::
        get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                  ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x3a123f);
        std::abs(__x);
        return in_XMM0_Qa < extraout_XMM0_Qa_00;
      }
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool changeDetected(const defV& prevValue, const NamedPoint& val, double deltaV)
{
    if ((prevValue.index() == double_loc) && (!std::isnan(val.value))) {
        return (std::abs(std::get<double>(prevValue) - val.value) > deltaV);
    }
    if (prevValue.index() == named_point_loc) {
        if ((std::get<NamedPoint>(prevValue).name == val.name) && (!std::isnan(val.value))) {
            return (std::abs(std::get<NamedPoint>(prevValue).value - val.value) > deltaV);
        }
    }
    return true;
}